

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

bool __thiscall
ON_SubDComponentBase::GetSavedSubdivisionPoint(ON_SubDComponentBase *this,double *subdivision_point)

{
  byte bVar1;
  
  bVar1 = this->m_saved_points_flags;
  if (subdivision_point != (double *)0x0 && (bVar1 & 0x40) != 0) {
    *subdivision_point = this->m_saved_subd_point1[0];
    subdivision_point[1] = this->m_saved_subd_point1[1];
    subdivision_point[2] = this->m_saved_subd_point1[2];
  }
  return (bool)((bVar1 & 0x40) >> 6);
}

Assistant:

bool ON_SubDComponentBase::GetSavedSubdivisionPoint(
  double subdivision_point[3]
  ) const
{
  if ( 0 == (ON_SUBD_CACHE_POINT_FLAG_BIT & m_saved_points_flags) )
    return false;

  if (nullptr != subdivision_point)
  {
    subdivision_point[0] = m_saved_subd_point1[0];
    subdivision_point[1] = m_saved_subd_point1[1];
    subdivision_point[2] = m_saved_subd_point1[2];
  }

  return true;
}